

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType_const&,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
          (Section *this,OpType *args,shared_ptr<mocker::nasm::Addr> *args_1,
          shared_ptr<mocker::nasm::Addr> *args_2)

{
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  emplaceLine<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType_const&,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
            (this,&local_48,args,args_1,args_2);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }